

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O0

int __thiscall
highs::RbTree<HighsNodeQueue::SuboptimalNodeRbTree>::unlink
          (RbTree<HighsNodeQueue::SuboptimalNodeRbTree> *this,char *__name)

{
  byte bVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int iVar2;
  LinkType LVar3;
  RbTree<HighsNodeQueue::SuboptimalNodeRbTree> *pRVar4;
  char *pcVar5;
  RbTree<HighsNodeQueue::SuboptimalNodeRbTree> *pRVar6;
  LinkType unaff_retaddr;
  LinkType in_stack_00000008;
  RbTree<HighsNodeQueue::SuboptimalNodeRbTree> *in_stack_00000010;
  LinkType zLeft;
  LinkType zRight;
  LinkType x;
  bool yWasBlack;
  LinkType y;
  LinkType nilParent;
  LinkType in_stack_ffffffffffffffa8;
  RbTree<HighsNodeQueue::SuboptimalNodeRbTree> *in_stack_ffffffffffffffb0;
  RbTree<HighsNodeQueue::SuboptimalNodeRbTree> *in_stack_ffffffffffffffc0;
  LinkType *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd8;
  
  pRVar4 = (RbTree<HighsNodeQueue::SuboptimalNodeRbTree> *)__name;
  bVar1 = isBlack(in_stack_ffffffffffffffc0,(LinkType)this);
  LVar3 = getChild(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,kLeft);
  if (LVar3 == -1) {
    LVar3 = getChild(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,kLeft);
    transplant(pRVar4,CONCAT17(bVar1,in_stack_ffffffffffffffd8),LVar3,in_stack_ffffffffffffffc8);
    iVar2 = extraout_EAX;
  }
  else {
    LVar3 = getChild(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,kLeft);
    if (LVar3 == -1) {
      LVar3 = getChild(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,kLeft);
      transplant(pRVar4,CONCAT17(bVar1,in_stack_ffffffffffffffd8),LVar3,in_stack_ffffffffffffffc8);
      iVar2 = extraout_EAX_00;
    }
    else {
      getChild(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,kLeft);
      pRVar4 = (RbTree<HighsNodeQueue::SuboptimalNodeRbTree> *)
               first(this,(LinkType)in_stack_ffffffffffffffb0);
      bVar1 = isBlack(in_stack_ffffffffffffffc0,(LinkType)this);
      LVar3 = getChild(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,kLeft);
      pcVar5 = (char *)getParent(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      if (pcVar5 == __name) {
        if (LVar3 != -1) {
          setParent(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x65fc69);
        }
      }
      else {
        pRVar6 = pRVar4;
        getChild(pRVar4,in_stack_ffffffffffffffa8,kLeft);
        transplant(pRVar6,CONCAT17(bVar1,in_stack_ffffffffffffffd8),LVar3,in_stack_ffffffffffffffc8)
        ;
        in_stack_ffffffffffffffc8 = (LinkType *)getChild(pRVar4,in_stack_ffffffffffffffa8,kLeft);
        setChild(in_stack_ffffffffffffffc0,(LinkType)this,(Dir)((ulong)pRVar4 >> 0x20),
                 in_stack_ffffffffffffffa8);
        setParent(pRVar4,in_stack_ffffffffffffffa8,0x65fce6);
        in_stack_ffffffffffffffb0 = pRVar4;
        pRVar4 = pRVar6;
      }
      transplant(pRVar4,CONCAT17(bVar1,in_stack_ffffffffffffffd8),LVar3,in_stack_ffffffffffffffc8);
      pRVar6 = (RbTree<HighsNodeQueue::SuboptimalNodeRbTree> *)
               getChild(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,kLeft);
      setChild(pRVar6,(LinkType)this,(Dir)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
               in_stack_ffffffffffffffa8);
      setParent(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x65fd3f);
      getColor(in_stack_ffffffffffffffb0,(LinkType)pRVar4);
      setColor(in_stack_ffffffffffffffb0,(LinkType)pRVar4,0);
      iVar2 = extraout_EAX_01;
    }
  }
  if ((bVar1 & 1) != 0) {
    deleteFixup(in_stack_00000010,in_stack_00000008,unaff_retaddr);
    iVar2 = extraout_EAX_02;
  }
  return iVar2;
}

Assistant:

void unlink(LinkType z) {
    LinkType nilParent = kNoLink;
    LinkType y = z;
    bool yWasBlack = isBlack(y);
    LinkType x;

    if (getChild(z, kLeft) == kNoLink) {
      x = getChild(z, kRight);
      transplant(z, x, nilParent);
    } else if (getChild(z, kRight) == kNoLink) {
      x = getChild(z, kLeft);
      transplant(z, x, nilParent);
    } else {
      y = first(getChild(z, kRight));
      yWasBlack = isBlack(y);
      x = getChild(y, kRight);
      if (getParent(y) == z) {
        if (x == kNoLink)
          nilParent = y;
        else
          setParent(x, y);
      } else {
        transplant(y, getChild(y, kRight), nilParent);
        LinkType zRight = getChild(z, kRight);
        setChild(y, kRight, zRight);
        setParent(zRight, y);
      }
      transplant(z, y, nilParent);
      LinkType zLeft = getChild(z, kLeft);
      setChild(y, kLeft, zLeft);
      setParent(zLeft, y);
      setColor(y, getColor(z));
    }

    if (yWasBlack) deleteFixup(x, nilParent);
  }